

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_round>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  long lVar3;
  int iVar4;
  long *in_RDI;
  undefined1 in_ZMM0 [64];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_round op;
  Mat *m;
  int local_1dc;
  undefined1 (*local_190) [32];
  int local_188;
  
  lVar3 = in_RDI[7];
  iVar4 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
          (int)in_RDI[3];
  for (local_188 = 0; local_188 < (int)lVar3; local_188 = local_188 + 1) {
    local_190 = (undefined1 (*) [32])(*in_RDI + in_RDI[8] * (long)local_188 * in_RDI[2]);
    for (local_1dc = 0; local_1dc + 7 < iVar4; local_1dc = local_1dc + 8) {
      auVar2 = vroundps_avx(*local_190,8);
      in_ZMM0 = ZEXT3264(auVar2);
      *local_190 = auVar2;
      local_190 = local_190 + 1;
    }
    for (; local_1dc + 3 < iVar4; local_1dc = local_1dc + 4) {
      auVar1 = vroundps_avx(*(undefined1 (*) [16])*local_190,8);
      in_ZMM0 = ZEXT1664(auVar1);
      *(undefined1 (*) [16])*local_190 = auVar1;
      local_190 = (undefined1 (*) [32])(*local_190 + 0x10);
    }
    for (; local_1dc < iVar4; local_1dc = local_1dc + 1) {
      auVar1 = vroundss_avx(in_ZMM0._0_16_,ZEXT416(*(uint *)*local_190),0xc);
      in_ZMM0 = ZEXT1664(auVar1);
      *(int *)*local_190 = auVar1._0_4_;
      local_190 = (undefined1 (*) [32])(*local_190 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}